

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::absI64x2(Literal *__return_storage_ptr__,Literal *this)

{
  long lVar1;
  Literal *this_00;
  Literal local_70;
  undefined1 local_58 [8];
  LaneArray<2> lanes;
  
  getLanesI64x2((LaneArray<2> *)local_58,this);
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0x18) {
    this_00 = (Literal *)(local_58 + lVar1);
    abs(&local_70,(int)this_00);
    if (this_00 != &local_70) {
      ~Literal(this_00);
      Literal(this_00,&local_70);
    }
    ~Literal(&local_70);
  }
  Literal(__return_storage_ptr__,(LaneArray<2> *)local_58);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::absI64x2() const {
  return unary<2, &Literal::getLanesI64x2, &Literal::abs>(*this);
}